

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

void xmlFAParseCharClassEsc(xmlRegParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlChar *pxVar2;
  int iVar3;
  xmlRegAtomPtr pxVar4;
  xmlRegAtomType xVar5;
  char *extra;
  uint start;
  
  pxVar2 = ctxt->cur;
  if (*pxVar2 != '\\') {
    if (*pxVar2 != '.') {
      ctxt->error = 0x5aa;
      extra = "Escaped sequence: expecting \\";
      goto LAB_001a6fdb;
    }
    pxVar4 = ctxt->atom;
    if (pxVar4 == (xmlRegAtomPtr)0x0) {
      pxVar4 = xmlRegNewAtom(ctxt,XML_REGEXP_ANYCHAR);
      ctxt->atom = pxVar4;
      goto LAB_001a7061;
    }
    if (pxVar4->type != XML_REGEXP_RANGES) goto LAB_001a7061;
    iVar3 = ctxt->neg;
    xVar5 = XML_REGEXP_ANYCHAR;
    start = 0;
LAB_001a705c:
    xmlRegAtomAddRange(ctxt,pxVar4,iVar3,xVar5,start,start,(xmlChar *)0x0);
LAB_001a7061:
    ctxt->cur = ctxt->cur + 1;
    return;
  }
  ctxt->cur = pxVar2 + 1;
  bVar1 = pxVar2[1];
  start = (uint)bVar1;
  switch(bVar1) {
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x3a:
  case 0x3b:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x60:
  case 0x6e:
  case 0x72:
  case 0x74:
  case 0x75:
  case 0x7b:
  case 0x7c:
  case 0x7d:
  case 0x7e:
    pxVar4 = ctxt->atom;
    if (pxVar4 == (xmlRegAtomPtr)0x0) {
      pxVar4 = xmlRegNewAtom(ctxt,XML_REGEXP_CHARVAL);
      ctxt->atom = pxVar4;
      if (pxVar4 != (xmlRegAtomPtr)0x0) {
        switch(bVar1) {
        case 0x6e:
          pxVar4->codepoint = 10;
          break;
        default:
          pxVar4->codepoint = start;
          break;
        case 0x72:
          pxVar4->codepoint = 0xd;
          break;
        case 0x74:
          pxVar4->codepoint = 9;
          break;
        case 0x75:
          iVar3 = parse_escaped_codepoint(ctxt);
          if (iVar3 < 0) {
            return;
          }
          ctxt->atom->codepoint = iVar3;
        }
      }
      goto LAB_001a7061;
    }
    if (pxVar4->type != XML_REGEXP_RANGES) goto LAB_001a7061;
    if (start == 0x74) {
      start = 9;
    }
    else if (start == 0x72) {
      start = 0xd;
    }
    else if (start == 0x6e) {
      start = 10;
    }
    iVar3 = ctxt->neg;
    xVar5 = XML_REGEXP_CHARVAL;
    goto LAB_001a705c;
  default:
    ctxt->error = 0x5aa;
    extra = "Wrong escape sequence, misuse of character \'\\\'";
    goto LAB_001a6fdb;
  case 0x43:
    xVar5 = XML_REGEXP_NOTNAMECHAR;
    break;
  case 0x44:
    xVar5 = XML_REGEXP_NOTDECIMAL;
    break;
  case 0x49:
    xVar5 = XML_REGEXP_NOTINITNAME;
    break;
  case 0x50:
    ctxt->cur = pxVar2 + 2;
    if (pxVar2[2] != '{') {
LAB_001a7198:
      ctxt->error = 0x5aa;
      extra = "Expecting \'{\'";
      goto LAB_001a6fdb;
    }
    ctxt->cur = pxVar2 + 3;
    xmlFAParseCharProp(ctxt);
    if (ctxt->atom != (xmlRegAtomPtr)0x0) {
      ctxt->atom->neg = 1;
    }
    goto LAB_001a7183;
  case 0x53:
    xVar5 = XML_REGEXP_NOTSPACE;
    break;
  case 0x57:
    xVar5 = XML_REGEXP_NOTREALCHAR;
    break;
  case 99:
    xVar5 = XML_REGEXP_NAMECHAR;
    break;
  case 100:
    xVar5 = XML_REGEXP_DECIMAL;
    break;
  case 0x69:
    xVar5 = XML_REGEXP_INITNAME;
    break;
  case 0x70:
    ctxt->cur = pxVar2 + 2;
    if (pxVar2[2] != '{') goto LAB_001a7198;
    ctxt->cur = pxVar2 + 3;
    xmlFAParseCharProp(ctxt);
LAB_001a7183:
    if (*ctxt->cur == '}') {
      ctxt->cur = ctxt->cur + 1;
      return;
    }
    ctxt->error = 0x5aa;
    extra = "Expecting \'}\'";
LAB_001a6fdb:
    xmlRegexpErrCompile(ctxt,extra);
    return;
  case 0x73:
    xVar5 = XML_REGEXP_ANYSPACE;
    break;
  case 0x77:
    xVar5 = XML_REGEXP_REALCHAR;
  }
  ctxt->cur = pxVar2 + 2;
  pxVar4 = ctxt->atom;
  if (pxVar4 == (xmlRegAtomPtr)0x0) {
    pxVar4 = xmlRegNewAtom(ctxt,xVar5);
    ctxt->atom = pxVar4;
  }
  else if (pxVar4->type == XML_REGEXP_RANGES) {
    xmlRegAtomAddRange(ctxt,pxVar4,ctxt->neg,xVar5,0,0,(xmlChar *)0x0);
  }
  return;
}

Assistant:

static void
xmlFAParseCharClassEsc(xmlRegParserCtxtPtr ctxt) {
    int cur;

    if (CUR == '.') {
	if (ctxt->atom == NULL) {
	    ctxt->atom = xmlRegNewAtom(ctxt, XML_REGEXP_ANYCHAR);
	} else if (ctxt->atom->type == XML_REGEXP_RANGES) {
	    xmlRegAtomAddRange(ctxt, ctxt->atom, ctxt->neg,
			       XML_REGEXP_ANYCHAR, 0, 0, NULL);
	}
	NEXT;
	return;
    }
    if (CUR != '\\') {
	ERROR("Escaped sequence: expecting \\");
	return;
    }
    NEXT;
    cur = CUR;
    if (cur == 'p') {
	NEXT;
	if (CUR != '{') {
	    ERROR("Expecting '{'");
	    return;
	}
	NEXT;
	xmlFAParseCharProp(ctxt);
	if (CUR != '}') {
	    ERROR("Expecting '}'");
	    return;
	}
	NEXT;
    } else if (cur == 'P') {
	NEXT;
	if (CUR != '{') {
	    ERROR("Expecting '{'");
	    return;
	}
	NEXT;
	xmlFAParseCharProp(ctxt);
        if (ctxt->atom != NULL)
	    ctxt->atom->neg = 1;
	if (CUR != '}') {
	    ERROR("Expecting '}'");
	    return;
	}
	NEXT;
    } else if ((cur == 'n') || (cur == 'r') || (cur == 't') || (cur == '\\') ||
	(cur == '|') || (cur == '.') || (cur == '?') || (cur == '*') ||
	(cur == '+') || (cur == '(') || (cur == ')') || (cur == '{') ||
	(cur == '}') || (cur == 0x2D) || (cur == 0x5B) || (cur == 0x5D) ||
	(cur == 0x5E) ||

	/* Non-standard escape sequences:
	 *                  Java 1.8|.NET Core 3.1|MSXML 6 */
	(cur == '!') ||     /*   +  |     +       |    +   */
	(cur == '"') ||     /*   +  |     +       |    +   */
	(cur == '#') ||     /*   +  |     +       |    +   */
	(cur == '$') ||     /*   +  |     +       |    +   */
	(cur == '%') ||     /*   +  |     +       |    +   */
	(cur == ',') ||     /*   +  |     +       |    +   */
	(cur == '/') ||     /*   +  |     +       |    +   */
	(cur == ':') ||     /*   +  |     +       |    +   */
	(cur == ';') ||     /*   +  |     +       |    +   */
	(cur == '=') ||     /*   +  |     +       |    +   */
	(cur == '>') ||     /*      |     +       |    +   */
	(cur == '@') ||     /*   +  |     +       |    +   */
	(cur == '`') ||     /*   +  |     +       |    +   */
	(cur == '~') ||     /*   +  |     +       |    +   */
	(cur == 'u')) {     /*      |     +       |    +   */
	if (ctxt->atom == NULL) {
	    ctxt->atom = xmlRegNewAtom(ctxt, XML_REGEXP_CHARVAL);
	    if (ctxt->atom != NULL) {
	        switch (cur) {
		    case 'n':
		        ctxt->atom->codepoint = '\n';
			break;
		    case 'r':
		        ctxt->atom->codepoint = '\r';
			break;
		    case 't':
		        ctxt->atom->codepoint = '\t';
			break;
		    case 'u':
			cur = parse_escaped_codepoint(ctxt);
			if (cur < 0) {
			    return;
			}
			ctxt->atom->codepoint = cur;
			break;
		    default:
			ctxt->atom->codepoint = cur;
		}
	    }
	} else if (ctxt->atom->type == XML_REGEXP_RANGES) {
            switch (cur) {
                case 'n':
                    cur = '\n';
                    break;
                case 'r':
                    cur = '\r';
                    break;
                case 't':
                    cur = '\t';
                    break;
            }
	    xmlRegAtomAddRange(ctxt, ctxt->atom, ctxt->neg,
			       XML_REGEXP_CHARVAL, cur, cur, NULL);
	}
	NEXT;
    } else if ((cur == 's') || (cur == 'S') || (cur == 'i') || (cur == 'I') ||
	(cur == 'c') || (cur == 'C') || (cur == 'd') || (cur == 'D') ||
	(cur == 'w') || (cur == 'W')) {
	xmlRegAtomType type = XML_REGEXP_ANYSPACE;

	switch (cur) {
	    case 's':
		type = XML_REGEXP_ANYSPACE;
		break;
	    case 'S':
		type = XML_REGEXP_NOTSPACE;
		break;
	    case 'i':
		type = XML_REGEXP_INITNAME;
		break;
	    case 'I':
		type = XML_REGEXP_NOTINITNAME;
		break;
	    case 'c':
		type = XML_REGEXP_NAMECHAR;
		break;
	    case 'C':
		type = XML_REGEXP_NOTNAMECHAR;
		break;
	    case 'd':
		type = XML_REGEXP_DECIMAL;
		break;
	    case 'D':
		type = XML_REGEXP_NOTDECIMAL;
		break;
	    case 'w':
		type = XML_REGEXP_REALCHAR;
		break;
	    case 'W':
		type = XML_REGEXP_NOTREALCHAR;
		break;
	}
	NEXT;
	if (ctxt->atom == NULL) {
	    ctxt->atom = xmlRegNewAtom(ctxt, type);
	} else if (ctxt->atom->type == XML_REGEXP_RANGES) {
	    xmlRegAtomAddRange(ctxt, ctxt->atom, ctxt->neg,
			       type, 0, 0, NULL);
	}
    } else {
	ERROR("Wrong escape sequence, misuse of character '\\'");
    }
}